

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseEncryptionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncryption *encryption)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  unsigned_long_long uVar5;
  uchar *puVar6;
  long unaff_RBP;
  ContentEncoding *this_00;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_68;
  ulong local_60;
  longlong local_58;
  uchar **local_50;
  uchar **local_48;
  uchar **local_40;
  ContentEncAESSettings *local_38;
  
  stop = size + start;
  local_38 = &encryption->aes_settings;
  local_40 = &encryption->sig_key_id;
  local_48 = &encryption->signature;
  local_50 = &encryption->key_id;
  local_68 = start;
  do {
    if (stop <= local_68) {
      return 0;
    }
    this_00 = (ContentEncoding *)pReader;
    lVar4 = ParseElementHeader(pReader,&local_68,stop,&local_58,(longlong *)&local_60);
    if (lVar4 < 0) {
      bVar1 = false;
      goto LAB_001613c9;
    }
    switch(local_58) {
    case 0x47e1:
      uVar5 = UnserializeUInt(pReader,local_68,local_60);
      encryption->algo = uVar5;
      if (uVar5 == 5) break;
      lVar4 = -2;
      goto LAB_001612cf;
    case 0x47e2:
      if (*local_50 != (uchar *)0x0) {
        operator_delete__(*local_50);
      }
      uVar2 = local_60;
      *local_50 = (uchar *)0x0;
      local_50[1] = (uchar *)0x0;
      if ((long)local_60 < 1) {
LAB_0016127f:
        lVar4 = -2;
        bVar1 = false;
        goto LAB_001613c9;
      }
      if (local_60 < 0x80000001) {
        puVar6 = (uchar *)operator_new__(local_60,(nothrow_t *)&std::nothrow);
      }
      else {
        puVar6 = (uchar *)0x0;
      }
      if (puVar6 == (uchar *)0x0) {
LAB_00161386:
        unaff_RBP = -1;
        bVar1 = false;
      }
      else {
        iVar3 = (**pReader->_vptr_IMkvReader)(pReader,local_68,uVar2);
        if (iVar3 == 0) {
          encryption->key_id = puVar6;
          encryption->key_id_len = uVar2;
          goto LAB_00161399;
        }
LAB_00161378:
        operator_delete__(puVar6);
        bVar1 = false;
        unaff_RBP = 0;
      }
      goto LAB_0016139b;
    case 0x47e3:
      if (*local_48 != (uchar *)0x0) {
        operator_delete__(*local_48);
      }
      uVar2 = local_60;
      *local_48 = (uchar *)0x0;
      local_48[1] = (uchar *)0x0;
      if ((long)local_60 < 1) goto LAB_0016127f;
      if (local_60 < 0x80000001) {
        puVar6 = (uchar *)operator_new__(local_60,(nothrow_t *)&std::nothrow);
      }
      else {
        puVar6 = (uchar *)0x0;
      }
      if (puVar6 == (uchar *)0x0) goto LAB_00161386;
      iVar3 = (**pReader->_vptr_IMkvReader)(pReader,local_68,uVar2);
      if (iVar3 != 0) goto LAB_00161378;
      encryption->signature = puVar6;
      encryption->signature_len = uVar2;
      goto LAB_00161399;
    case 0x47e4:
      if (*local_40 != (uchar *)0x0) {
        operator_delete__(*local_40);
      }
      uVar2 = local_60;
      *local_40 = (uchar *)0x0;
      local_40[1] = (uchar *)0x0;
      if ((long)local_60 < 1) goto LAB_0016127f;
      if (local_60 < 0x80000001) {
        puVar6 = (uchar *)operator_new__(local_60,(nothrow_t *)&std::nothrow);
      }
      else {
        puVar6 = (uchar *)0x0;
      }
      if (puVar6 == (uchar *)0x0) goto LAB_00161386;
      iVar3 = (**pReader->_vptr_IMkvReader)(pReader,local_68,uVar2);
      if (iVar3 != 0) goto LAB_00161378;
      encryption->sig_key_id = puVar6;
      encryption->sig_key_id_len = uVar2;
LAB_00161399:
      bVar1 = true;
LAB_0016139b:
      lVar4 = unaff_RBP;
      if (bVar1) break;
LAB_001612cf:
      bVar1 = false;
      goto LAB_001613c9;
    case 0x47e5:
      uVar5 = UnserializeUInt(pReader,local_68,local_60);
      encryption->sig_algo = uVar5;
      break;
    case 0x47e6:
      uVar5 = UnserializeUInt(pReader,local_68,local_60);
      encryption->sig_hash_algo = uVar5;
      break;
    case 0x47e7:
      lVar4 = ParseContentEncAESSettingsEntry(this_00,local_68,local_60,pReader,local_38);
      if (lVar4 != 0) goto LAB_001612cf;
    }
    local_68 = local_68 + local_60;
    bVar1 = local_68 <= stop;
    lVar4 = unaff_RBP;
    if (stop < local_68) {
      lVar4 = -2;
    }
LAB_001613c9:
    unaff_RBP = lVar4;
    if (!bVar1) {
      return lVar4;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseEncryptionEntry(long long start, long long size,
                                           IMkvReader* pReader,
                                           ContentEncryption* encryption) {
  assert(pReader);
  assert(encryption);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncAlgo) {
      encryption->algo = UnserializeUInt(pReader, pos, size);
      if (encryption->algo != 5)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvContentEncKeyID) {
      delete[] encryption->key_id;
      encryption->key_id = NULL;
      encryption->key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->key_id = buf;
      encryption->key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSignature) {
      delete[] encryption->signature;
      encryption->signature = NULL;
      encryption->signature_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->signature = buf;
      encryption->signature_len = buflen;
    } else if (id == libwebm::kMkvContentSigKeyID) {
      delete[] encryption->sig_key_id;
      encryption->sig_key_id = NULL;
      encryption->sig_key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->sig_key_id = buf;
      encryption->sig_key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSigAlgo) {
      encryption->sig_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentSigHashAlgo) {
      encryption->sig_hash_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncAESSettings) {
      const long status = ParseContentEncAESSettingsEntry(
          pos, size, pReader, &encryption->aes_settings);
      if (status)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}